

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jitffi-sysv64.cpp
# Opt level: O1

void __thiscall JitFFI::SysV64::ArgOPList::add(ArgOPList *this,uint id,OP op,uint num)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,op) != 4) {
    ArgOPCounter::add(&this->counter,op);
    p_Var2 = (_List_node_base *)operator_new(0x20);
    *(OP *)&p_Var2[1]._M_next = op;
    *(uint *)((long)&p_Var2[1]._M_next + 4) = id;
    *(uint *)&p_Var2[1]._M_prev = num;
    std::__detail::_List_node_base::_M_hook(p_Var2);
    psVar1 = &(this->datalist).data.c.
              super__List_base<JitFFI::SysV64::ArgOPList::Data,_std::allocator<JitFFI::SysV64::ArgOPList::Data>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    return;
  }
  __assert_fail("op != ArgTypeInfo::op_struct",
                "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/source/jitffi-sysv64.cpp"
                ,0x259,
                "void JitFFI::SysV64::ArgOPList::add(unsigned int, ArgTypeInfo::OP, unsigned int)");
}

Assistant:

void add(unsigned int id, ArgTypeInfo::OP op, unsigned int num = 0) {
				assert(op != ArgTypeInfo::op_struct);
				counter.add(op);
				datalist.add({ op, id, num });
			}